

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp.c
# Opt level: O2

void rtp_rfc3119_pkt_pack(rtp_pkt_t *pkt)

{
  ulong uVar1;
  byte bVar2;
  
  if (pkt != (rtp_pkt_t *)0x0) {
    uVar1 = pkt->length;
    bVar2 = *(byte *)&pkt->rfc3119_b;
    *(byte *)&pkt->rfc3119_b = (0x3f < uVar1) * '\x02' | bVar2 & 0xfd;
    bVar2 = bVar2 << 7;
    if (uVar1 < 0x40) {
      bVar2 = bVar2 | (byte)uVar1;
    }
    else {
      bVar2 = (byte)(uVar1 >> 8) & 0x3f | bVar2 | 0x40;
      pkt->length = uVar1 + 1;
      pkt->data[0xd] = (uchar)(uVar1 + 1);
    }
    pkt->data[0xc] = bVar2;
    return;
  }
  __assert_fail("pkt != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp.c",
                0x152,"void rtp_rfc3119_pkt_pack(rtp_pkt_t *)");
}

Assistant:

void    rtp_rfc3119_pkt_pack(rtp_pkt_t *pkt) {
  assert(pkt != NULL);

  unsigned char *ptr = pkt->data + RTP_HDR_SIZE;
  
  if (pkt->length > ((1 << 6) - 1))
    pkt->rfc3119_b.t = 1;
  else
    pkt->rfc3119_b.t = 0;

  if (pkt->rfc3119_b.t) {
    /* 14 bits length */
    *ptr = pkt->rfc3119_b.c << 7;
    *ptr |= 1 << 6;
    *ptr |= ((pkt->length >> 8) & 0x3f);
    ptr++;
    pkt->length++;
    *ptr = (pkt->length & 0xFF);
  } else {
    /* 6 bits length */
    *ptr = 0;
    *ptr = (pkt->length & 0x3f);
    *ptr |= pkt->rfc3119_b.c << 7;
  }
}